

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O0

SobolSampler *
pbrt::SobolSampler::Create
          (ParameterDictionary *parameters,Point2i *fullResolution,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  int *piVar4;
  SobolSampler *pSVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string s;
  RandomizeStrategy randomizer;
  int nsamp;
  string *in_stack_fffffffffffffee8;
  ParameterDictionary *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefc;
  undefined1 in_stack_fffffffffffffefd;
  undefined1 in_stack_fffffffffffffefe;
  Point2<int> *args_1;
  polymorphic_allocator<std::byte> *this;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff40;
  ParameterDictionary *in_stack_ffffffffffffff48;
  undefined8 local_a1;
  string local_80 [32];
  undefined4 local_60;
  allocator<char> local_49;
  string local_48 [36];
  int local_24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  __s = &local_49;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,(char *)__s,(allocator<char> *)in_RDI);
  iVar3 = ParameterDictionary::GetOneInt(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,0);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  local_24 = iVar3;
  bVar1 = pstd::optional::operator_cast_to_bool((optional *)(Options + 0x18));
  if (bVar1) {
    piVar4 = pstd::optional<int>::operator*((optional<int> *)0x776dff);
    local_24 = *piVar4;
  }
  if ((*(byte *)(Options + 8) & 1) != 0) {
    local_24 = 1;
  }
  this = (polymorphic_allocator<std::byte> *)&local_a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,(char *)__s,(allocator<char> *)in_RDI);
  args_1 = (Point2<int> *)&stack0xffffffffffffff37;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,(char *)__s,(allocator<char> *)in_RDI);
  ParameterDictionary::GetOneString
            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff37);
  std::__cxx11::string::~string((string *)((long)&local_a1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
  if ((bool)uVar2) {
    local_60 = 0;
  }
  else {
    in_stack_fffffffffffffefe =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
    if ((bool)in_stack_fffffffffffffefe) {
      local_60 = 1;
    }
    else {
      in_stack_fffffffffffffefd =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
      if ((bool)in_stack_fffffffffffffefd) {
        local_60 = 2;
      }
      else {
        in_stack_fffffffffffffefc =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
        if (!(bool)in_stack_fffffffffffffefc) {
          ErrorExit<std::__cxx11::string&>((FileLoc *)in_stack_ffffffffffffff30,(char *)__s,in_RDI);
        }
        local_60 = 3;
      }
    }
  }
  pSVar5 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::SobolSampler,int&,pbrt::Point2<int>const&,pbrt::RandomizeStrategy&>
                     (this,(int *)local_10,args_1,
                      (RandomizeStrategy *)
                      CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffefe,
                                              CONCAT15(in_stack_fffffffffffffefd,
                                                       CONCAT14(in_stack_fffffffffffffefc,
                                                                in_stack_fffffffffffffef8)))));
  std::__cxx11::string::~string(local_80);
  return pSVar5;
}

Assistant:

SobolSampler *SobolSampler::Create(const ParameterDictionary &parameters,
                                   const Point2i &fullResolution, const FileLoc *loc,
                                   Allocator alloc) {
    int nsamp = parameters.GetOneInt("pixelsamples", 16);
    if (Options->pixelSamples)
        nsamp = *Options->pixelSamples;
    if (Options->quickRender)
        nsamp = 1;

    RandomizeStrategy randomizer;
    std::string s = parameters.GetOneString("randomization", "owen");
    if (s == "none")
        randomizer = RandomizeStrategy::None;
    else if (s == "cranleypatterson")
        randomizer = RandomizeStrategy::CranleyPatterson;
    else if (s == "xor")
        randomizer = RandomizeStrategy::Xor;
    else if (s == "owen")
        randomizer = RandomizeStrategy::Owen;
    else
        ErrorExit(loc, "%s: unknown randomization strategy given to SobolSampler", s);

    return alloc.new_object<SobolSampler>(nsamp, fullResolution, randomizer);
}